

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  uint *puVar1;
  Status stat;
  int iVar2;
  pointer pnVar3;
  ostream *poVar4;
  uint uVar5;
  type_conflict5 tVar6;
  int iVar7;
  SPxOut *pSVar8;
  char *t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *a;
  int i;
  long lVar9;
  long lVar10;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  long local_f8;
  Verbosity local_ec;
  cpp_dec_float<50U,_int,_void> local_e8;
  DIdxSet *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  leavetol(&local_a0,this);
  this->m_pricingViolCoUpToDate = true;
  this_00 = &this->m_pricingViolCo;
  lVar10 = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&this_00->m_backend,0);
  local_a8 = &this->infeasibilitiesCo;
  (this->infeasibilitiesCo).super_IdxSet.num = 0;
  local_f8 = (long)(this->thevectors->set).thenum;
  local_e8.fpclass = cpp_dec_float_finite;
  local_e8.prec_elem = 10;
  local_e8.data._M_elems[0] = 0;
  local_e8.data._M_elems[1] = 0;
  local_e8.data._M_elems[2] = 0;
  local_e8.data._M_elems[3] = 0;
  local_e8.data._M_elems[4] = 0;
  local_e8.data._M_elems[5] = 0;
  local_e8.data._M_elems._24_5_ = 0;
  local_e8.data._M_elems[7]._1_3_ = 0;
  local_e8.data._M_elems._32_5_ = 0;
  local_e8.data._M_elems[9]._1_3_ = 0;
  local_e8.exp = 0;
  local_e8.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
            (&local_e8,&(this->sparsePricingFactor).m_backend,&local_f8);
  iVar7 = boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::convert_to<int>((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_e8);
  for (lVar9 = 0; lVar9 < (this->thevectors->set).thenum; lVar9 = lVar9 + 1) {
    stat = ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedesc.stat)->data[lVar9];
    if (this->theRep * stat < 1) {
      test((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_e8,this,(int)lVar9,stat);
      pnVar3 = (this->theTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)(pnVar3->m_backend).data._M_elems + lVar10 + 0x20) =
           CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
      puVar1 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar10 + 0x10);
      *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_);
      puVar1 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar10);
      *(undefined8 *)puVar1 = local_e8.data._M_elems._0_8_;
      *(undefined8 *)(puVar1 + 2) = local_e8.data._M_elems._8_8_;
      *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar10) = local_e8.exp;
      *(bool *)((long)(&(pnVar3->m_backend).data + 1) + lVar10 + 4U) = local_e8.neg;
      *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar10 + 8U) = local_e8._48_8_;
      a = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)((long)(((this->theTest).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar10)
      ;
      local_e8.data._M_elems[9]._1_3_ = local_a0.m_backend.data._M_elems[9]._1_3_;
      local_e8.data._M_elems._32_5_ = local_a0.m_backend.data._M_elems._32_5_;
      local_e8.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
      local_e8.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
      local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
      uVar5 = local_e8.data._M_elems[0];
      if (this->remainingRoundsEnterCo == 0) {
        local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
        local_e8.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
        local_e8.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
        local_e8.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
        local_e8.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
        local_e8.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
        local_e8.exp = local_a0.m_backend.exp;
        local_e8.neg = local_a0.m_backend.neg;
        local_e8.fpclass = local_a0.m_backend.fpclass;
        local_e8.prec_elem = local_a0.m_backend.prec_elem;
        if (local_a0.m_backend.fpclass != cpp_dec_float_finite || uVar5 != 0) {
          local_e8.neg = (bool)(local_a0.m_backend.neg ^ 1);
        }
        tVar6 = boost::multiprecision::operator<
                          (a,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_e8);
        if (tVar6) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&this_00->m_backend,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)(((this->theTest).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar10));
          DIdxSet::addIdx(local_a8,(int)lVar9);
          (this->isInfeasibleCo).data[lVar9] = 1;
          this->m_numViol = this->m_numViol + 1;
        }
        else {
          (this->isInfeasibleCo).data[lVar9] = 0;
        }
        if (iVar7 < (this->infeasibilitiesCo).super_IdxSet.num) {
          pSVar8 = this->spxout;
          if ((pSVar8 != (SPxOut *)0x0) && (3 < (int)pSVar8->m_verbosity)) {
            local_e8.data._M_elems[0] = pSVar8->m_verbosity;
            local_f8 = CONCAT44(local_f8._4_4_,4);
            (*pSVar8->_vptr_SPxOut[2])(pSVar8,&local_f8);
            pSVar8 = soplex::operator<<(this->spxout," --- using dense pricing");
            std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
            (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_e8);
          }
          this->remainingRoundsEnterCo = 5;
          this->sparsePricingEnterCo = false;
          (this->infeasibilitiesCo).super_IdxSet.num = 0;
        }
      }
      else {
        local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
        local_e8.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
        local_e8.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
        local_e8.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
        local_e8.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
        local_e8.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
        local_e8.exp = local_a0.m_backend.exp;
        local_e8.neg = local_a0.m_backend.neg;
        local_e8.fpclass = local_a0.m_backend.fpclass;
        local_e8.prec_elem = local_a0.m_backend.prec_elem;
        if (local_a0.m_backend.fpclass != cpp_dec_float_finite || uVar5 != 0) {
          local_e8.neg = (bool)(local_a0.m_backend.neg ^ 1);
        }
        tVar6 = boost::multiprecision::operator<
                          (a,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_e8);
        if (tVar6) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&this_00->m_backend,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)(((this->theTest).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar10));
          this->m_numViol = this->m_numViol + 1;
        }
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)
                 ((long)(((this->theTest).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar10),0.0);
      if (this->remainingRoundsEnterCo == 0) {
        (this->isInfeasibleCo).data[lVar9] = 0;
      }
    }
    lVar10 = lVar10 + 0x38;
  }
  iVar2 = (this->infeasibilitiesCo).super_IdxSet.num;
  if ((iVar2 == 0) && (this->sparsePricingEnterCo == false)) {
    this->remainingRoundsEnterCo = this->remainingRoundsEnterCo + -1;
  }
  else if ((iVar2 <= iVar7) && (this->sparsePricingEnterCo == false)) {
    pSVar8 = this->spxout;
    if ((pSVar8 != (SPxOut *)0x0) && (local_ec = pSVar8->m_verbosity, 3 < (int)local_ec)) {
      local_e8.data._M_elems[0] = 4;
      (*pSVar8->_vptr_SPxOut[2])();
      pSVar8 = this->spxout;
      iVar7 = *(int *)(pSVar8->m_streams[pSVar8->m_verbosity] +
                      *(long *)(*(long *)pSVar8->m_streams[pSVar8->m_verbosity] + -0x18) + 8);
      t = " --- using sparse pricing, ";
      if (this->hyperPricingEnter != false) {
        t = " --- using hypersparse pricing, ";
      }
      soplex::operator<<(pSVar8,t);
      pSVar8 = soplex::operator<<(this->spxout,"sparsity: ");
      poVar4 = pSVar8->m_streams[pSVar8->m_verbosity];
      lVar9 = *(long *)poVar4;
      *(undefined8 *)(poVar4 + *(long *)(lVar9 + -0x18) + 0x10) = 6;
      *(uint *)(poVar4 + *(long *)(lVar9 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(lVar9 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar4 + *(long *)(lVar9 + -0x18) + 8) = 4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_e8,(long)(this->infeasibilitiesCo).super_IdxSet.num,(type *)0x0);
      local_f8 = (long)(this->thevectors->set).thenum;
      local_68.fpclass = cpp_dec_float_finite;
      local_68.prec_elem = 10;
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      local_68.data._M_elems[2] = 0;
      local_68.data._M_elems[3] = 0;
      local_68.data._M_elems[4] = 0;
      local_68.data._M_elems[5] = 0;
      local_68.data._M_elems._24_5_ = 0;
      local_68.data._M_elems[7]._1_3_ = 0;
      local_68.data._M_elems._32_5_ = 0;
      local_68._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (&local_68,&local_e8,&local_f8);
      pSVar8 = soplex::operator<<(pSVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_68);
      poVar4 = pSVar8->m_streams[pSVar8->m_verbosity];
      lVar9 = *(long *)poVar4;
      lVar10 = *(long *)(lVar9 + -0x18);
      *(uint *)(poVar4 + lVar10 + 0x18) = *(uint *)(poVar4 + lVar10 + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar4 + *(long *)(lVar9 + -0x18) + 8) = (long)iVar7;
      std::endl<char,std::char_traits<char>>(poVar4);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_ec);
    }
    this->sparsePricingEnterCo = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeTest()
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();
   m_pricingViolCoUpToDate = true;
   m_pricingViolCo = 0;

   infeasibilitiesCo.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * coDim());

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(isBasic(stat))
      {
         theTest[i] = 0.0;

         if(remainingRoundsEnterCo == 0)
            isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         assert(!isBasic(stat));
         theTest[i] = test(i, stat);

         if(remainingRoundsEnterCo == 0)
         {
            if(theTest[i] < -pricingTol)
            {
               assert(infeasibilitiesCo.size() < infeasibilitiesCo.max());
               m_pricingViolCo -= theTest[i];
               infeasibilitiesCo.addIdx(i);
               isInfeasibleCo[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilitiesCo.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnterCo = SOPLEX_DENSEROUNDS;
               sparsePricingEnterCo = false;
               infeasibilitiesCo.clear();
            }
         }
         else if(theTest[i] < -pricingTol)
         {
            m_pricingViolCo -= theTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilitiesCo.size() == 0 && !sparsePricingEnterCo)
      --remainingRoundsEnterCo;
   else if(infeasibilitiesCo.size() <= sparsitythreshold && !sparsePricingEnterCo)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilitiesCo.size() / coDim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnterCo = true;
   }
}